

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O1

void __thiscall
ylt::metric::basic_dynamic_histogram<double,_(unsigned_char)'\x02'>::serialize
          (basic_dynamic_histogram<double,_(unsigned_char)__x02_> *this,string *str)

{
  basic_dynamic_counter<double,_(unsigned_char)__x02_> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  pointer psVar3;
  long lVar4;
  double dVar5;
  string value_str;
  vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
  bucket_counts;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
  value_map;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  element_type *local_b0;
  double local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
  local_80;
  string *local_68;
  pointer local_60;
  pointer local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
  local_48;
  
  util::
  map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<137ul>>
  ::
  copy<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_pair>,ylt::util::map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<137ul>>::copy<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_pair>>()const::_lambda(auto:1&)_1_>
            (&local_48,
             &(((this->sum_).
                super___shared_ptr<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>).
              super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>.map_,
             (anon_class_1_0_00000001 *)&local_a0);
  if (local_48.
      super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    metric_t::serialize_head((metric_t *)this,str);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::
    vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>_>_>
    ::vector(&local_80,&this->bucket_counts_);
    local_60 = local_48.
               super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_48.
        super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_50 = &(this->super_dynamic_metric).super_metric_t.labels_name_;
      psVar3 = local_48.
               super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_68 = str;
      do {
        local_b0 = (psVar3->
                   super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
        if (ABS((local_b0->value).super___atomic_float<double>._M_fp) != 0.0) {
          local_58 = psVar3;
          if (local_80.
              super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_80.
              super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_a8 = 0.0;
          }
          else {
            local_a8 = 0.0;
            lVar4 = 8;
            uVar2 = 0;
            do {
              this_00 = *(basic_dynamic_counter<double,_(unsigned_char)__x02_> **)
                         ((long)local_80.
                                super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar4 + -8);
              this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         ((long)&((local_80.
                                   super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar4);
              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_01->_M_use_count = this_01->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_01->_M_use_count = this_01->_M_use_count + 1;
                }
              }
              pbVar1 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_a0,
                                  (this->super_dynamic_metric).super_metric_t.name_._M_dataplus._M_p
                                  ,(this->super_dynamic_metric).super_metric_t.name_.
                                   _M_string_length);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(pbVar1,"_bucket{");
              if ((this->super_dynamic_metric).super_metric_t.labels_name_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (this->super_dynamic_metric).super_metric_t.labels_name_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                metric_t::build_label_string<std::array<std::__cxx11::string,2ul>>
                          ((metric_t *)this,&local_a0,local_50,&local_b0->label);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_a0,",");
              }
              if (uVar2 == (long)(this->bucket_boundaries_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(this->bucket_boundaries_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3) {
                pbVar1 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_a0,"le=\"");
                pbVar1 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (pbVar1,"+Inf");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(pbVar1,"\"} ");
              }
              else {
                pbVar1 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_a0,"le=\"");
                __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                          (&local_d0,vsnprintf,0x148,"%f",
                           (this->bucket_boundaries_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar2]);
                pbVar1 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(pbVar1,local_d0._M_dataplus._M_p,local_d0._M_string_length);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(pbVar1,"\"} ");
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  local_d0.field_2._M_allocated_capacity + 1);
                }
              }
              dVar5 = basic_dynamic_counter<double,_(unsigned_char)'\x02'>::value
                                (this_00,&local_b0->label);
              local_a8 = local_a8 + dVar5;
              __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                        (&local_d0,vsnprintf,0x148,"%f",local_a8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_a0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_a0,"\n");
              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
              }
              uVar2 = uVar2 + 1;
              lVar4 = lVar4 + 0x10;
            } while (uVar2 < (ulong)((long)local_80.
                                           super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_80.
                                           super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
          str = local_68;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_68,local_a0._M_dataplus._M_p,local_a0._M_string_length);
          psVar3 = local_58;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (str,(this->super_dynamic_metric).super_metric_t.name_._M_dataplus._M_p,
                     (this->super_dynamic_metric).super_metric_t.name_._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (str,"_sum{");
          metric_t::build_label_string<std::array<std::__cxx11::string,2ul>>
                    ((metric_t *)this,str,
                     &(((this->sum_).
                        super___shared_ptr<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>).
                      super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>.
                      super_dynamic_metric.super_metric_t.labels_name_,&local_b0->label);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (str,"} ");
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_d0,vsnprintf,0x148,"%f",
                     (local_b0->value).super___atomic_float<double>._M_fp);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (str,local_d0._M_dataplus._M_p,local_d0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (str,"\n");
          pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(str,(this->super_dynamic_metric).super_metric_t.name_._M_dataplus._M_p,
                             (this->super_dynamic_metric).super_metric_t.name_._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (pbVar1,"_count{");
          metric_t::build_label_string<std::array<std::__cxx11::string,2ul>>
                    ((metric_t *)this,str,
                     &(((this->sum_).
                        super___shared_ptr<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>).
                      super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>.
                      super_dynamic_metric.super_metric_t.labels_name_,&local_b0->label);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (str,"} ");
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_d0,vsnprintf,0x148,"%f",local_a8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (str,local_d0._M_dataplus._M_p,local_d0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (str,"\n");
        }
        psVar3 = psVar3 + 1;
      } while (psVar3 != local_60);
    }
    if (local_a0._M_string_length == 0) {
      str->_M_string_length = 0;
      *(str->_M_dataplus)._M_p = '\0';
    }
    std::
    vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>_>_>
    ::~vector(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
  }
  std::
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void serialize(std::string &str) override {
    auto value_map = sum_->copy();
    if (value_map.empty()) {
      return;
    }

    serialize_head(str);

    std::string value_str;
    auto bucket_counts = get_bucket_counts();
    for (auto &e : value_map) {
      auto &labels_value = e->label;
      auto &value = e->value;
      if (value == 0) {
        continue;
      }

      value_type count = 0;
      for (size_t i = 0; i < bucket_counts.size(); i++) {
        auto counter = bucket_counts[i];
        value_str.append(name_).append("_bucket{");
        if (!labels_name_.empty()) {
          build_label_string(value_str, labels_name_, labels_value);
          value_str.append(",");
        }

        if (i == bucket_boundaries_.size()) {
          value_str.append("le=\"").append("+Inf").append("\"} ");
        }
        else {
          value_str.append("le=\"")
              .append(std::to_string(bucket_boundaries_[i]))
              .append("\"} ");
        }

        count += counter->value(labels_value);
        value_str.append(std::to_string(count));
        value_str.append("\n");
      }

      str.append(value_str);

      str.append(name_);
      str.append("_sum{");
      build_label_string(str, sum_->labels_name(), labels_value);
      str.append("} ");

      str.append(std::to_string(value));
      str.append("\n");

      str.append(name_).append("_count{");
      build_label_string(str, sum_->labels_name(), labels_value);
      str.append("} ");
      str.append(std::to_string(count));
      str.append("\n");
    }
    if (value_str.empty()) {
      str.clear();
    }
  }